

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

bool __thiscall ON_OffsetSurfaceFunction::Initialize(ON_OffsetSurfaceFunction *this)

{
  undefined1 *this_00;
  undefined1 *this_01;
  uint row_size;
  ON_OffsetSurfaceValue *pOVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ON_BumpFunction *pOVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong new_capacity;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ON_Workspace ws;
  ON_3dVector Ds;
  ON_Matrix M;
  ON_3dVector Dt;
  double local_128;
  double local_118;
  double local_108;
  ON_Workspace local_b8;
  ON_3dVector local_a8;
  ON_Matrix local_90;
  ON_3dVector local_48;
  
  if (this->m_bValid == false) {
    row_size = (this->m_offset_value).m_count;
    new_capacity = (ulong)row_size;
    if ((0 < (int)row_size) && (this->m_srf != (ON_Surface *)0x0)) {
      ON_Workspace::ON_Workspace(&local_b8);
      uVar3 = (this->m_bumps).m_capacity;
      if (-1 < (int)uVar3) {
        (this->m_bumps).m_count = 0;
      }
      if (uVar3 < row_size) {
        ON_SimpleArray<ON_BumpFunction>::SetCapacity(&this->m_bumps,new_capacity);
      }
      this_00 = &this->field_0x8;
      this_01 = &this->field_0x18;
      uVar4 = 1;
      if (1 < (int)row_size) {
        uVar4 = (ulong)row_size;
      }
      lVar9 = 0;
      do {
        pOVar5 = ON_SimpleArray<ON_BumpFunction>::AppendNew(&this->m_bumps);
        pOVar1 = (this->m_offset_value).m_a;
        dVar12 = *(double *)((long)&pOVar1->m_s + lVar9);
        dVar13 = *(double *)((long)&pOVar1->m_t + lVar9);
        dVar14 = *(double *)((long)&pOVar1->m_radius + lVar9);
        pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,0);
        local_118 = dVar12 - *pdVar6;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,1);
        local_108 = *pdVar6 - dVar12;
        if ((local_118 != 0.0) || (NAN(local_118))) {
          if ((local_108 == 0.0) && (!NAN(local_108))) {
            local_108 = -local_118;
          }
        }
        else {
          local_118 = -local_108;
        }
        pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,0);
        dVar11 = dVar13 - *pdVar6;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,1);
        dVar15 = *pdVar6 - dVar13;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          if ((dVar15 == 0.0) && (!NAN(dVar15))) {
            dVar15 = -dVar11;
          }
        }
        else {
          dVar11 = -dVar15;
        }
        (pOVar5->m_point).x = dVar12;
        (pOVar5->m_point).y = dVar13;
        pOVar5->m_x0 = dVar12;
        pOVar5->m_y0 = dVar13;
        pOVar5->m_sx[0] = -1.0 / local_118;
        pOVar5->m_sx[1] = 1.0 / local_108;
        pOVar5->m_sy[0] = -1.0 / dVar11;
        pOVar5->m_sy[1] = 1.0 / dVar15;
        pOVar5->m_type[0] = 5;
        pOVar5->m_type[1] = 5;
        pOVar5->m_a = 1.0;
        if (dVar14 <= 0.0) {
          pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,0);
          if ((dVar12 != *pdVar6) || (NAN(dVar12) || NAN(*pdVar6))) {
LAB_00566cc1:
            dVar12 = (pOVar5->m_point).x;
            pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,1);
            if ((dVar12 == *pdVar6) && (!NAN(dVar12) && !NAN(*pdVar6))) {
              dVar12 = (pOVar5->m_point).y;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,0);
              if ((dVar12 == *pdVar6) && (!NAN(dVar12) && !NAN(*pdVar6))) {
                if ((this->m_bZeroSideDerivative[1] == false) &&
                   (this->m_bZeroSideDerivative[3] == false)) {
                  pOVar5->m_type[0] = 1;
                  pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,0);
                  pOVar5->m_x0 = *pdVar6;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar5->m_sx[0] = 1.0 / dVar12;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar5->m_sx[1] = 1.0 / dVar12;
                }
                if ((this->m_bZeroSideDerivative[0] != false) ||
                   (this->m_bZeroSideDerivative[2] != false)) goto LAB_00566f6c;
                pOVar5->m_type[1] = 1;
                pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,1);
                pOVar5->m_y0 = *pdVar6;
                dVar12 = ON_Interval::Length((ON_Interval *)this_01);
                pOVar5->m_sy[0] = -1.0 / dVar12;
                dVar12 = ON_Interval::Length((ON_Interval *)this_01);
                goto LAB_00566dc0;
              }
            }
            dVar12 = (pOVar5->m_point).x;
            pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,1);
            if ((dVar12 == *pdVar6) && (!NAN(dVar12) && !NAN(*pdVar6))) {
              dVar12 = (pOVar5->m_point).y;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,1);
              if ((dVar12 == *pdVar6) && (!NAN(dVar12) && !NAN(*pdVar6))) {
                if ((this->m_bZeroSideDerivative[1] == false) &&
                   (this->m_bZeroSideDerivative[3] == false)) {
                  pOVar5->m_type[0] = 1;
                  pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,0);
                  pOVar5->m_x0 = *pdVar6;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar5->m_sx[0] = 1.0 / dVar12;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar5->m_sx[1] = 1.0 / dVar12;
                }
                if ((this->m_bZeroSideDerivative[0] != false) ||
                   (this->m_bZeroSideDerivative[2] != false)) goto LAB_00566f6c;
                pOVar5->m_type[1] = 1;
                pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,0);
                pOVar5->m_y0 = *pdVar6;
                dVar12 = ON_Interval::Length((ON_Interval *)this_01);
                pOVar5->m_sy[0] = 1.0 / dVar12;
                dVar12 = ON_Interval::Length((ON_Interval *)this_01);
                dVar13 = 1.0;
                goto LAB_00566dc8;
              }
            }
            dVar12 = (pOVar5->m_point).x;
            pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,0);
            if ((dVar12 == *pdVar6) && (!NAN(dVar12) && !NAN(*pdVar6))) {
              dVar12 = (pOVar5->m_point).y;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,1);
              if ((dVar12 == *pdVar6) && (!NAN(dVar12) && !NAN(*pdVar6))) {
                if ((this->m_bZeroSideDerivative[1] == false) &&
                   (this->m_bZeroSideDerivative[3] == false)) {
                  pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,1);
                  pOVar5->m_x0 = *pdVar6;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar5->m_sx[0] = -1.0 / dVar12;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_00);
                  pOVar5->m_sx[1] = -1.0 / dVar12;
                  pOVar5->m_type[0] = 1;
                }
                if ((this->m_bZeroSideDerivative[0] == false) &&
                   (this->m_bZeroSideDerivative[2] == false)) {
                  pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,0);
                  pOVar5->m_y0 = *pdVar6;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_01);
                  pOVar5->m_sy[0] = 1.0 / dVar12;
                  dVar12 = ON_Interval::Length((ON_Interval *)this_01);
                  pOVar5->m_sy[1] = 1.0 / dVar12;
                  pOVar5->m_type[1] = 1;
                }
              }
            }
          }
          else {
            dVar12 = (pOVar5->m_point).y;
            pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,0);
            if ((dVar12 != *pdVar6) || (NAN(dVar12) || NAN(*pdVar6))) goto LAB_00566cc1;
            if ((this->m_bZeroSideDerivative[1] == false) &&
               (this->m_bZeroSideDerivative[3] == false)) {
              pOVar5->m_type[0] = 1;
              pdVar6 = ON_Interval::operator[]((ON_Interval *)this_00,1);
              pOVar5->m_x0 = *pdVar6;
              dVar12 = ON_Interval::Length((ON_Interval *)this_00);
              pOVar5->m_sx[0] = -1.0 / dVar12;
              dVar12 = ON_Interval::Length((ON_Interval *)this_00);
              pOVar5->m_sx[1] = -1.0 / dVar12;
            }
            if ((this->m_bZeroSideDerivative[0] != false) ||
               (this->m_bZeroSideDerivative[2] != false)) goto LAB_00566f6c;
            pOVar5->m_type[1] = 1;
            pdVar6 = ON_Interval::operator[]((ON_Interval *)this_01,1);
            pOVar5->m_y0 = *pdVar6;
            dVar12 = ON_Interval::Length((ON_Interval *)this_01);
            pOVar5->m_sy[0] = -1.0 / dVar12;
            dVar12 = ON_Interval::Length((ON_Interval *)this_01);
LAB_00566dc0:
            dVar13 = -1.0;
LAB_00566dc8:
            pOVar5->m_sy[1] = dVar13 / dVar12;
          }
        }
        else {
          bVar2 = ON_Surface::Ev1Der(this->m_srf,dVar12,dVar13,(ON_3dPoint *)&local_90,&local_a8,
                                     &local_48,0,(int *)0x0);
          if (bVar2) {
            dVar12 = ON_3dVector::Length(&local_a8);
            local_128 = local_118;
            if (local_118 <= local_108) {
              local_128 = local_108;
            }
            if ((2.3283064365386963e-10 < dVar12) && (dVar14 / dVar12 < local_128)) {
              local_128 = dVar14 / dVar12;
            }
            dVar13 = ON_3dVector::Length(&local_48);
            dVar12 = dVar11;
            if (dVar11 <= dVar15) {
              dVar12 = dVar15;
            }
            if ((2.3283064365386963e-10 < dVar13) && (dVar14 / dVar13 < dVar12)) {
              dVar12 = dVar14 / dVar13;
            }
            dVar13 = dVar12;
            if ((this->m_bZeroSideDerivative[0] != false) && (dVar11 <= dVar12)) {
              dVar13 = dVar11;
            }
            dVar14 = local_128;
            if ((this->m_bZeroSideDerivative[1] != false) && (local_108 <= local_128)) {
              dVar14 = local_108;
            }
            if ((this->m_bZeroSideDerivative[2] != false) && (dVar15 <= dVar12)) {
              dVar12 = dVar15;
            }
            if ((this->m_bZeroSideDerivative[3] != false) && (local_118 <= local_128)) {
              local_128 = local_118;
            }
            pOVar5->m_sx[0] = -1.0 / local_128;
            pOVar5->m_sx[1] = 1.0 / dVar14;
            pOVar5->m_sy[0] = -1.0 / dVar13;
            pOVar5->m_sy[1] = 1.0 / dVar12;
          }
        }
LAB_00566f6c:
        lVar9 = lVar9 + 0x28;
      } while (uVar4 * 0x28 != lVar9);
      ON_Matrix::ON_Matrix(&local_90,row_size,row_size);
      pdVar6 = (double *)onmalloc(new_capacity << 4);
      uVar4 = 1;
      if (1 < (int)row_size) {
        uVar4 = new_capacity;
      }
      uVar8 = 0;
      do {
        pOVar5 = (this->m_bumps).m_a;
        dVar12 = pOVar5[uVar8].m_point.x;
        dVar13 = pOVar5[uVar8].m_point.y;
        pdVar6[uVar8] = (this->m_offset_value).m_a[uVar8].m_distance;
        uVar10 = 0;
        do {
          ON_BumpFunction::Evaluate((this->m_bumps).m_a + uVar10,dVar12,dVar13,0,&local_a8.x);
          dVar14 = local_a8.x;
          pdVar7 = ON_Matrix::operator[](&local_90,(int)uVar8);
          pdVar7[uVar10] = dVar14;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar4);
      uVar3 = ON_Matrix::RowReduce(&local_90,2.3283064365386963e-10,pdVar6,(double *)0x0);
      if ((row_size == uVar3) &&
         (bVar2 = ON_Matrix::BackSolve
                            (&local_90,2.3283064365386963e-10,row_size,pdVar6,pdVar6 + new_capacity)
         , bVar2)) {
        this->m_bValid = true;
      }
      if (this->m_bValid == true) {
        uVar4 = 1;
        if (1 < (int)row_size) {
          uVar4 = new_capacity;
        }
        pdVar7 = &((this->m_bumps).m_a)->m_a;
        uVar8 = 0;
        do {
          *pdVar7 = (pdVar6 + new_capacity)[uVar8];
          uVar8 = uVar8 + 1;
          pdVar7 = pdVar7 + 10;
        } while (uVar4 != uVar8);
      }
      onfree(pdVar6);
      ON_Matrix::~ON_Matrix(&local_90);
      ON_Workspace::~ON_Workspace(&local_b8);
    }
  }
  return this->m_bValid;
}

Assistant:

bool ON_OffsetSurfaceFunction::Initialize()
{
  const int count = m_offset_value.Count();
  if ( !m_bValid && 0 != m_srf && count > 0)
  {
    ON_Workspace ws;
    m_bumps.SetCount(0);
    m_bumps.Reserve(count);
    int i;
    double a,b,ds,dt;
    
    for (i = 0; i < count; i++ )
    {
      ON_BumpFunction& bump = m_bumps.AppendNew();
      ON_OffsetSurfaceValue offset_value = m_offset_value[i];
      double ds0 = offset_value.m_s - m_domain[0][0];
      double ds1 = m_domain[0][1] - offset_value.m_s;
      if ( 0.0 == ds0 )
        ds0 = -ds1;
      else if ( 0.0 == ds1 )
        ds1 = -ds0;
      double dt0 = offset_value.m_t - m_domain[1][0];
      double dt1 = m_domain[1][1] - offset_value.m_t;
      if ( 0.0 == dt0 )
        dt0 = -dt1;
      else if ( 0.0 == dt1 )
        dt1 = -dt0;

      // default is a large cubic bump
      bump.m_point.x = offset_value.m_s;
      bump.m_point.y = offset_value.m_t;
      bump.m_x0 = bump.m_point.x;
      bump.m_y0 = bump.m_point.y;

      bump.m_sx[0] = -1.0/ds0;
      bump.m_sx[1] =  1.0/ds1;
      bump.m_sy[0] = -1.0/dt0;
      bump.m_sy[1] =  1.0/dt1;
      bump.m_type[0] = 5;
      bump.m_type[1] = 5;
      bump.m_a = 1.0;

      if ( offset_value.m_radius > 0.0 )
      {
        // user specified cubic bump size
        ON_3dPoint Pt;
        ON_3dVector Ds, Dt;
        if ( m_srf->Ev1Der(offset_value.m_s,offset_value.m_t,Pt,Ds,Dt) )
        {
          ds = (ds0>ds1) ? ds0 : ds1;
          dt = (dt0>dt1) ? dt0 : dt1;
          a = Ds.Length();
          if ( a > ON_ZERO_TOLERANCE )
          {
            b = offset_value.m_radius/a;
            if ( b < ds )
              ds = b;
          }
          a = Dt.Length();
          if ( a > ON_ZERO_TOLERANCE )
          {
            b = offset_value.m_radius/a;
            if ( b < dt )
              dt = b;
          }
          if ( !m_bZeroSideDerivative[0] || dt < dt0 )
            dt0 = dt;
          if ( !m_bZeroSideDerivative[1] || ds < ds1 )
            ds1 = ds;
          if ( !m_bZeroSideDerivative[2] || dt < dt1 )
            dt1 = dt;
          if ( !m_bZeroSideDerivative[3] || ds < ds0 )
            ds0 = ds;
          bump.m_sx[0] = -1.0/ds0;
          bump.m_sx[1] =  1.0/ds1;
          bump.m_sy[0] = -1.0/dt0;
          bump.m_sy[1] =  1.0/dt1;
        }
      }
      else if ( bump.m_point.x == m_domain[0][0] &&  bump.m_point.y == m_domain[1][0] )
      {
        // SW corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][1];
          bump.m_sx[0] = -1.0/m_domain[0].Length();
          bump.m_sx[1] = -1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][1];
          bump.m_sy[0] = -1.0/m_domain[1].Length();
          bump.m_sy[1] = -1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][1] &&  bump.m_point.y == m_domain[1][0] )
      {
        // SE corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][0];
          bump.m_sx[0] = 1.0/m_domain[0].Length();
          bump.m_sx[1] = 1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][1];
          bump.m_sy[0] = -1.0/m_domain[1].Length();
          bump.m_sy[1] = -1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][1] &&  bump.m_point.y == m_domain[1][1] )
      {
        // NE corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_type[0] = 1;
          bump.m_x0 = m_domain[0][0];
          bump.m_sx[0] = 1.0/m_domain[0].Length();
          bump.m_sx[1] = 1.0/m_domain[0].Length();
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_type[1] = 1;
          bump.m_y0 = m_domain[1][0];
          bump.m_sy[0] = 1.0/m_domain[1].Length();
          bump.m_sy[1] = 1.0/m_domain[1].Length();
        }
      }
      else if ( bump.m_point.x == m_domain[0][0] &&  bump.m_point.y == m_domain[1][1] )
      {
        // NW corner bilinear bump
        if ( !m_bZeroSideDerivative[1] && !m_bZeroSideDerivative[3] )
        {
          bump.m_x0 = m_domain[0][1];
          bump.m_sx[0] = -1.0/m_domain[0].Length();
          bump.m_sx[1] = -1.0/m_domain[0].Length();
          bump.m_type[0] = 1;
        }
        if ( !m_bZeroSideDerivative[0] && !m_bZeroSideDerivative[2] )
        {
          bump.m_y0 = m_domain[1][0];
          bump.m_sy[0] = 1.0/m_domain[1].Length();
          bump.m_sy[1] = 1.0/m_domain[1].Length();
          bump.m_type[1] = 1;
        }
      }
    }


    ON_Matrix M(count,count);
    double* B = (double*)onmalloc(2*count*sizeof(*B));
    double* X = B + count;
    int j;
    for ( i = 0; i < count; i++ ) 
    {
      ON_2dPoint p = m_bumps[i].m_point;
      B[i] = m_offset_value[i].m_distance;
      for ( j = 0; j < count; j++ )
      {
        M[i][j] = m_bumps[j].ValueAt(p.x,p.y);
      }
    }
    int rank = M.RowReduce(ON_ZERO_TOLERANCE,B);
    if ( count == rank )
    {
      if ( M.BackSolve(ON_ZERO_TOLERANCE,count,B,X) )
      {
        m_bValid = true;
      }
    }

    if ( !m_bValid )
    {
#if 0 //defined(TL2_MATRIX_INC_)
      // Have access to SVD - try it
      for ( i = 0; i < count; i++ ) 
      {
        ON_2dPoint p = m_bumps[i].m_point;
        B[i] = m_offset_value[i].m_distance;
        for ( j = 0; j < count; j++ )
        {
          M[i][j] = m_bumps[j].ValueAt(p.x,p.y);
        }
      }
      ON_Matrix U, V;
      double* diagonal = (double*)onmalloc(2*count*sizeof(*diagonal));
      double* inverted_diagonal = diagonal + count;
      if ( TL2_MatrixSVD(M,U,diagonal,V,30) )
      {
        rank = TL2_MatrixSVDInvertDiagonal(count,diagonal,inverted_diagonal);
        if ( rank > 0 )
        {
          if ( TL2_MatrixSVDSolve(U,inverted_diagonal,V,1,B,1,X) )
          {
            m_bValid = true;
          }
        }
      }
#endif
    }

    if ( m_bValid )
    {
      for ( i = 0; i < count; i++ )
      {
        m_bumps[i].m_a = X[i];
      }
    }

    onfree(B);
  }
  return m_bValid;
}